

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall
ClipperLib::Clipper::FixupFirstLefts2(Clipper *this,OutRec *InnerOutRec,OutRec *OuterOutRec)

{
  OutRec *pOVar1;
  _func_int **pp_Var2;
  long lVar3;
  OutRec *pOVar4;
  OutPt *OutPt1;
  OutRec *FirstLeft;
  bool bVar5;
  OutRec *pOVar6;
  size_type i;
  ulong uVar7;
  
  pOVar1 = OuterOutRec->FirstLeft;
  pp_Var2 = this->_vptr_Clipper;
  uVar7 = 0;
  do {
    lVar3 = *(long *)((long)&this->m_ClipType + (long)pp_Var2[-3]);
    if ((ulong)(*(long *)(pp_Var2[-3] +
                         (long)&(this->m_Maxima).
                                super__List_base<long_long,_std::allocator<long_long>_>) - lVar3 >>
               3) <= uVar7) {
      return;
    }
    pOVar4 = *(OutRec **)(lVar3 + uVar7 * 8);
    if (((pOVar4 != InnerOutRec) && (pOVar4 != OuterOutRec)) &&
       (OutPt1 = pOVar4->Pts, OutPt1 != (OutPt *)0x0)) {
      FirstLeft = pOVar4->FirstLeft;
      pOVar6 = ParseFirstLeft(FirstLeft);
      if (((pOVar6 == OuterOutRec) || (pOVar6 == pOVar1)) || (pOVar6 == InnerOutRec)) {
        bVar5 = Poly2ContainsPoly1(OutPt1,InnerOutRec->Pts);
        pOVar6 = InnerOutRec;
        if (!bVar5) {
          bVar5 = Poly2ContainsPoly1(OutPt1,OuterOutRec->Pts);
          pOVar6 = OuterOutRec;
          if ((!bVar5) && (pOVar6 = pOVar1, FirstLeft != InnerOutRec && FirstLeft != OuterOutRec))
          goto LAB_0027e143;
        }
        pOVar4->FirstLeft = pOVar6;
      }
    }
LAB_0027e143:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void Clipper::FixupFirstLefts2(OutRec* InnerOutRec, OutRec* OuterOutRec)
{
  //A polygon has split into two such that one is now the inner of the other.
  //It's possible that these polygons now wrap around other polygons, so check
  //every polygon that's also contained by OuterOutRec's FirstLeft container
  //(including 0) to see if they've become inner to the new inner polygon ...
  OutRec* orfl = OuterOutRec->FirstLeft;
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec* outRec = m_PolyOuts[i];

    if (!outRec->Pts || outRec == OuterOutRec || outRec == InnerOutRec)
      continue;
    OutRec* firstLeft = ParseFirstLeft(outRec->FirstLeft);
    if (firstLeft != orfl && firstLeft != InnerOutRec && firstLeft != OuterOutRec)
      continue;
    if (Poly2ContainsPoly1(outRec->Pts, InnerOutRec->Pts))
      outRec->FirstLeft = InnerOutRec;
    else if (Poly2ContainsPoly1(outRec->Pts, OuterOutRec->Pts))
      outRec->FirstLeft = OuterOutRec;
    else if (outRec->FirstLeft == InnerOutRec || outRec->FirstLeft == OuterOutRec)
      outRec->FirstLeft = orfl;
  }
}